

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void lyd_wd_leaflist_cleanup(ly_set *set,unres_data *unres)

{
  lys_node **pplVar1;
  lys_node *node;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)set->number;
  uVar3 = 0;
  do {
    if (uVar2 == uVar3) {
      return;
    }
    pplVar1 = (set->set).s + uVar3;
    uVar3 = uVar3 + 1;
  } while (((ulong)(*pplVar1)->dsc & 0x100) != 0);
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    node = (set->set).s[uVar3];
    if (((ulong)node->dsc & 0x100) != 0) {
      if (unres->store_diff == 0) {
        lyd_free((lyd_node *)node);
      }
      else {
        unres_data_diff_new(unres,(lyd_node *)node,(lyd_node *)node->iffeature,0);
        lyd_unlink((lyd_node *)(set->set).s[uVar3]);
      }
    }
    uVar2 = (ulong)set->number;
  }
  return;
}

Assistant:

static void
lyd_wd_leaflist_cleanup(struct ly_set *set, struct unres_data *unres)
{
    unsigned int i;

    assert(set);

    /* if there is an instance without the dflt flag, we have to
     * remove all instances with the flag - an instance could be
     * explicitely added, so the default leaflists were invalidated */
    for (i = 0; i < set->number; i++) {
        if (!set->set.d[i]->dflt) {
            break;
        }
    }
    if (i < set->number) {
        for (i = 0; i < set->number; i++) {
            if (set->set.d[i]->dflt) {
                /* remove this default instance */
                if (unres->store_diff) {
                    /* just move it to diff if is being generated */
                    unres_data_diff_new(unres, set->set.d[i], set->set.d[i]->parent, 0);
                    lyd_unlink(set->set.d[i]);
                } else {
                    lyd_free(set->set.d[i]);
                }
            }
        }
    }
}